

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O0

bool InliningDecider::GetBuiltInInfoCommon
               (uint localFuncId,OpCode *inlineCandidateOpCode,ValueType *returnType)

{
  bool bVar1;
  Bits bits;
  ValueType VVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_68;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_66;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_64;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_62;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_60;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_58;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_56 [2];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_50;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4c [2];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46 [3];
  anon_union_2_4_ea848c7b_for_ValueType_13 *local_40;
  ValueType *returnType_local;
  OpCode *inlineCandidateOpCode_local;
  uint localFuncId_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_24;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_20;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  ValueType merged;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a;
  
  local_40 = &returnType->field_0;
  returnType_local = (ValueType *)inlineCandidateOpCode;
  inlineCandidateOpCode_local._0_4_ = localFuncId;
  switch(localFuncId) {
  case 4:
  case 0x19:
  case 0x1c:
  case 0x2a:
  case 0xbb:
  case 0xcb:
  case 0xd0:
  case 0xd1:
  case 0xd7:
    VVar2 = ValueType::GetNumberAndLikelyInt(true);
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar2.field_0;
    goto LAB_00730332;
  default:
    return false;
  case 0x13:
    local_58.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_56[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_58.field_0,true);
    VVar2 = ValueType::SetArrayTypeId((ValueType *)&local_56[0].field_0,TypeIds_Array);
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar2.field_0;
    break;
  case 0x14:
  case 0x15:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x27:
  case 0xc9:
  case 0xf2:
    goto LAB_00730332;
  case 0x1a:
  case 0x2b:
  case 0x94:
  case 0x96:
    (returnType->field_0).field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)ValueType::Boolean
    ;
    goto LAB_00730332;
  case 0x1b:
  case 0xca:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd6:
  case 0xd8:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe4:
  case 0xf9:
  case 0xfa:
    (returnType->field_0).field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)ValueType::String;
    goto LAB_00730332;
  case 0x1e:
    *inlineCandidateOpCode = InlineArrayPop;
    break;
  case 0x1f:
    *inlineCandidateOpCode = InlineArrayPush;
    break;
  case 0x80:
    *inlineCandidateOpCode = InlineFunctionApply;
    break;
  case 0x82:
    *inlineCandidateOpCode = InlineFunctionCall;
    break;
  case 0xb6:
  case 0xd3:
    local_50.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_4e.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_50.field_0,true);
    local_4c[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetArrayTypeId((ValueType *)&local_4e.field_0,TypeIds_Array);
    VVar2 = ValueType::Null;
    local_52 = ValueType::Null.field_0;
    merged = ValueType::Verify((ValueType)local_4c[0].field_0);
    local_1e = VVar2.field_0;
    local_20.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::Verify(VVar2);
    local_22 = VVar2.field_0;
    bVar1 = ValueType::operator==((ValueType *)&local_4c[0].field_0,VVar2);
    if (bVar1) {
      local_a.field_0 = local_4c[0].field_0;
    }
    else {
      bits = operator|(local_4c[0].bits,(Bits)VVar2.field_0);
      ValueType::ValueType((ValueType *)&local_24.field_0,bits);
      bVar1 = ValueType::OneOn((ValueType *)&local_24.field_0,Object);
      if (bVar1) {
        localFuncId_local._0_2_ = VVar2.field_0;
        local_a.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::MergeWithObject((ValueType *)&local_4c[0].field_0,VVar2);
      }
      else {
        localFuncId_local._2_2_ = local_24.field_0;
        local_a.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::Verify(local_24.field_0);
      }
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_a;
    goto LAB_00730332;
  case 0xd9:
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_46[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_48.field_0,true);
    VVar2 = ValueType::SetArrayTypeId((ValueType *)&local_46[0].field_0,TypeIds_Array);
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar2.field_0;
LAB_00730332:
    (returnType_local->field_0).bits =
         Float|IntIsLikelyUntagged|Int|Object|CanBeTaggedValue|Undefined|Likely;
    break;
  case 0x105:
    *inlineCandidateOpCode = InlineMathAbs;
    break;
  case 0x106:
    *inlineCandidateOpCode = InlineMathAcos;
    break;
  case 0x107:
    *inlineCandidateOpCode = InlineMathAsin;
    break;
  case 0x108:
    *inlineCandidateOpCode = InlineMathAtan;
    break;
  case 0x109:
    *inlineCandidateOpCode = InlineMathAtan2;
    break;
  case 0x10a:
    *inlineCandidateOpCode = InlineMathCeil;
    break;
  case 0x10b:
    *inlineCandidateOpCode = InlineMathCos;
    break;
  case 0x10c:
    *inlineCandidateOpCode = InlineMathExp;
    break;
  case 0x10d:
    *inlineCandidateOpCode = InlineMathFloor;
    break;
  case 0x10e:
    *inlineCandidateOpCode = InlineMathLog;
    break;
  case 0x10f:
    *inlineCandidateOpCode = InlineMathMax;
    break;
  case 0x110:
    *inlineCandidateOpCode = InlineMathMin;
    break;
  case 0x111:
    *inlineCandidateOpCode = InlineMathPow;
    break;
  case 0x112:
    *inlineCandidateOpCode = InlineMathRandom;
    break;
  case 0x113:
    *inlineCandidateOpCode = InlineMathRound;
    break;
  case 0x114:
    *inlineCandidateOpCode = InlineMathSin;
    break;
  case 0x115:
    *inlineCandidateOpCode = InlineMathSqrt;
    break;
  case 0x116:
    *inlineCandidateOpCode = InlineMathTan;
    break;
  case 0x125:
    *inlineCandidateOpCode = InlineMathImul;
    break;
  case 0x126:
    *inlineCandidateOpCode = InlineMathClz;
    break;
  case 0x13d:
    *inlineCandidateOpCode = InlineMathFround;
    (returnType->field_0).field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)ValueType::Float;
    break;
  case 0x161:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_5a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Int8Array);
    }
    else {
      local_5a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Int8MixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_5a;
    break;
  case 0x162:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_5c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Uint8Array);
    }
    else {
      local_5c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Uint8MixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_5c;
    break;
  case 0x163:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_5e.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Uint8ClampedArray);
    }
    else {
      local_5e.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Uint8ClampedMixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_5e;
    break;
  case 0x164:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_60.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Int16Array);
    }
    else {
      local_60.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Int16MixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_60;
    break;
  case 0x165:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_62.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Uint16Array);
    }
    else {
      local_62.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Uint16MixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_62;
    break;
  case 0x166:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_64.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Int32Array);
    }
    else {
      local_64.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Int32MixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_64;
    break;
  case 0x167:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_66.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Uint32Array);
    }
    else {
      local_66.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Uint32MixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_66;
    break;
  case 0x168:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_68.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Float32Array);
    }
    else {
      local_68.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Float32MixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_68;
    break;
  case 0x169:
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,TypedArrayVirtualPhase);
    if (bVar1) {
      local_6a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Float64Array);
    }
    else {
      local_6a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Float64MixedArray);
    }
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_6a;
    break;
  case 0x16a:
    VVar2 = ValueType::GetObject(Int64Array);
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar2.field_0;
    break;
  case 0x16b:
    VVar2 = ValueType::GetObject(Uint64Array);
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar2.field_0;
    break;
  case 0x16c:
    VVar2 = ValueType::GetObject(CharArray);
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar2.field_0;
    break;
  case 0x16d:
    VVar2 = ValueType::GetObject(BoolArray);
    local_40->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)VVar2.field_0;
    break;
  case 0x1ea:
    *inlineCandidateOpCode = InlineCallInstanceFunction;
  }
  return true;
}

Assistant:

bool InliningDecider::GetBuiltInInfoCommon(
    uint localFuncId,
    Js::OpCode *const inlineCandidateOpCode,
    ValueType *const returnType
    )
{
    // TODO: consider adding another column to JavascriptBuiltInFunctionList.h/LibraryFunction.h
    // and getting helper method from there instead of multiple switch labels. And for return value types too.
    switch (localFuncId)
    {
    case Js::JavascriptBuiltInFunction::Math_Abs:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAbs;
        break;

    case Js::JavascriptBuiltInFunction::Math_Acos:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAcos;
        break;

    case Js::JavascriptBuiltInFunction::Math_Asin:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAsin;
        break;

    case Js::JavascriptBuiltInFunction::Math_Atan:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAtan;
        break;

    case Js::JavascriptBuiltInFunction::Math_Atan2:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAtan2;
        break;

    case Js::JavascriptBuiltInFunction::Math_Cos:
        *inlineCandidateOpCode = Js::OpCode::InlineMathCos;
        break;

    case Js::JavascriptBuiltInFunction::Math_Exp:
        *inlineCandidateOpCode = Js::OpCode::InlineMathExp;
        break;

    case Js::JavascriptBuiltInFunction::Math_Log:
        *inlineCandidateOpCode = Js::OpCode::InlineMathLog;
        break;

    case Js::JavascriptBuiltInFunction::Math_Pow:
        *inlineCandidateOpCode = Js::OpCode::InlineMathPow;
        break;

    case Js::JavascriptBuiltInFunction::Math_Sin:
        *inlineCandidateOpCode = Js::OpCode::InlineMathSin;
        break;

    case Js::JavascriptBuiltInFunction::Math_Sqrt:
        *inlineCandidateOpCode = Js::OpCode::InlineMathSqrt;
        break;

    case Js::JavascriptBuiltInFunction::Math_Tan:
        *inlineCandidateOpCode = Js::OpCode::InlineMathTan;
        break;

    case Js::JavascriptBuiltInFunction::Math_Floor:
        *inlineCandidateOpCode = Js::OpCode::InlineMathFloor;
        break;

    case Js::JavascriptBuiltInFunction::Math_Ceil:
        *inlineCandidateOpCode = Js::OpCode::InlineMathCeil;
        break;

    case Js::JavascriptBuiltInFunction::Math_Round:
        *inlineCandidateOpCode = Js::OpCode::InlineMathRound;
        break;

    case Js::JavascriptBuiltInFunction::Math_Min:
        *inlineCandidateOpCode = Js::OpCode::InlineMathMin;
        break;

    case Js::JavascriptBuiltInFunction::Math_Max:
        *inlineCandidateOpCode = Js::OpCode::InlineMathMax;
        break;

    case Js::JavascriptBuiltInFunction::Math_Imul:
        *inlineCandidateOpCode = Js::OpCode::InlineMathImul;
        break;

    case Js::JavascriptBuiltInFunction::Math_Clz32:
        *inlineCandidateOpCode = Js::OpCode::InlineMathClz;
        break;

    case Js::JavascriptBuiltInFunction::Math_Random:
        *inlineCandidateOpCode = Js::OpCode::InlineMathRandom;
        break;

    case Js::JavascriptBuiltInFunction::Math_Fround:
        *inlineCandidateOpCode = Js::OpCode::InlineMathFround;
        *returnType = ValueType::Float;
        break;

    case Js::JavascriptBuiltInFunction::JavascriptArray_Push:
        *inlineCandidateOpCode = Js::OpCode::InlineArrayPush;
        break;

    case Js::JavascriptBuiltInFunction::JavascriptArray_Pop:
        *inlineCandidateOpCode = Js::OpCode::InlineArrayPop;
        break;

    case Js::JavascriptBuiltInFunction::JavascriptArray_At:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Concat:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Reverse:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Shift:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Slice:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Splice:

    case Js::JavascriptBuiltInFunction::JavascriptString_At:
    case Js::JavascriptBuiltInFunction::JavascriptString_Link:
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptArray_Join:
    case Js::JavascriptBuiltInFunction::JavascriptString_CharAt:
    case Js::JavascriptBuiltInFunction::JavascriptString_Concat:
    case Js::JavascriptBuiltInFunction::JavascriptString_FromCharCode:
    case Js::JavascriptBuiltInFunction::JavascriptString_FromCodePoint:
    case Js::JavascriptBuiltInFunction::JavascriptString_Replace:
    case Js::JavascriptBuiltInFunction::JavascriptString_Slice:
    case Js::JavascriptBuiltInFunction::JavascriptString_Substr:
    case Js::JavascriptBuiltInFunction::JavascriptString_Substring:
    case Js::JavascriptBuiltInFunction::JavascriptString_ToLocaleLowerCase:
    case Js::JavascriptBuiltInFunction::JavascriptString_ToLocaleUpperCase:
    case Js::JavascriptBuiltInFunction::JavascriptString_ToLowerCase:
    case Js::JavascriptBuiltInFunction::JavascriptString_ToUpperCase:
    case Js::JavascriptBuiltInFunction::JavascriptString_Trim:
    case Js::JavascriptBuiltInFunction::JavascriptString_TrimLeft:
    case Js::JavascriptBuiltInFunction::JavascriptString_TrimRight:
    case Js::JavascriptBuiltInFunction::JavascriptString_PadStart:
    case Js::JavascriptBuiltInFunction::JavascriptString_PadEnd:
        *returnType = ValueType::String;
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptArray_Includes:
    case Js::JavascriptBuiltInFunction::JavascriptObject_HasOwnProperty:
    case Js::JavascriptBuiltInFunction::JavascriptObject_HasOwn:
    case Js::JavascriptBuiltInFunction::JavascriptArray_IsArray:
        *returnType = ValueType::Boolean;
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptArray_IndexOf:
    case Js::JavascriptBuiltInFunction::JavascriptArray_LastIndexOf:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Unshift:
    case Js::JavascriptBuiltInFunction::JavascriptString_CharCodeAt:
    case Js::JavascriptBuiltInFunction::JavascriptString_IndexOf:
    case Js::JavascriptBuiltInFunction::JavascriptString_LastIndexOf:
    case Js::JavascriptBuiltInFunction::JavascriptString_Search:
    case Js::JavascriptBuiltInFunction::JavascriptRegExp_SymbolSearch:
    case Js::JavascriptBuiltInFunction::GlobalObject_ParseInt:
        *returnType = ValueType::GetNumberAndLikelyInt(true);
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptString_Split:
        *returnType = ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(Js::TypeIds_Array);
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptString_Match:
    case Js::JavascriptBuiltInFunction::JavascriptRegExp_Exec:
        *returnType =
            ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(Js::TypeIds_Array)
                .Merge(ValueType::Null);
        goto CallDirectCommon;

    CallDirectCommon:
        *inlineCandidateOpCode = Js::OpCode::CallDirect;
        break;

    case Js::JavascriptBuiltInFunction::JavascriptFunction_Apply:
        *inlineCandidateOpCode = Js::OpCode::InlineFunctionApply;
        break;
    case Js::JavascriptBuiltInFunction::JavascriptFunction_Call:
        *inlineCandidateOpCode = Js::OpCode::InlineFunctionCall;
        break;
    case Js::JavascriptBuiltInFunction::EngineInterfaceObject_CallInstanceFunction:
        *inlineCandidateOpCode = Js::OpCode::InlineCallInstanceFunction;
        break;

    // The following are not currently inlined, but are tracked for their return type
    // TODO: Add more built-ins that return objects. May consider tracking all built-ins.

    case Js::JavascriptBuiltInFunction::JavascriptArray_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(Js::TypeIds_Array);
        break;

    case Js::JavascriptBuiltInFunction::Int8Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Int8MixedArray) : ValueType::GetObject(ObjectType::Int8Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Int8Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Uint8Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Uint8MixedArray) : ValueType::GetObject(ObjectType::Uint8Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Uint8Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Uint8ClampedArray_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Uint8ClampedMixedArray) : ValueType::GetObject(ObjectType::Uint8ClampedArray);
#else
        *returnType = ValueType::GetObject(ObjectType::Uint8ClampedArray);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Int16Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Int16MixedArray) : ValueType::GetObject(ObjectType::Int16Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Int16Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Uint16Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Uint16MixedArray) : ValueType::GetObject(ObjectType::Uint16Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Uint16Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Int32Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Int32MixedArray) : ValueType::GetObject(ObjectType::Int32Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Int32Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Uint32Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Uint32MixedArray) : ValueType::GetObject(ObjectType::Uint32Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Uint32Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Float32Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Float32MixedArray) : ValueType::GetObject(ObjectType::Float32Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Float32Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Float64Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Float64MixedArray) : ValueType::GetObject(ObjectType::Float64Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Float64Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Int64Array_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::Int64Array);
        break;

    case Js::JavascriptBuiltInFunction::Uint64Array_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::Uint64Array);
        break;

    case Js::JavascriptBuiltInFunction::BoolArray_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::BoolArray);
        break;

    case Js::JavascriptBuiltInFunction::CharArray_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::CharArray);
        break;

    default:
        return false;
    }
    return true;
}